

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

int instruction_is_valid(m68k_info *info,uint word_check)

{
  uint uVar1;
  
  uVar1 = info->ir;
  if (((g_instruction_table[uVar1].word2_mask == 0) ||
      ((g_instruction_table[uVar1].word2_mask & word_check) ==
       g_instruction_table[uVar1].word2_match)) &&
     (g_instruction_table[uVar1].instruction != d68000_invalid)) {
    return 1;
  }
  d68000_invalid(info);
  return 0;
}

Assistant:

static int instruction_is_valid(m68k_info *info, const unsigned int word_check)
{
	const unsigned int instruction = info->ir;
	instruction_struct *i = &g_instruction_table[instruction];

	if ( (i->word2_mask && ((word_check & i->word2_mask) != i->word2_match)) ||
		(i->instruction == d68000_invalid) ) {
		d68000_invalid(info);
		return 0;
	}

	return 1;
}